

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

int CoRoutineFunc(stCoRoutine_t *co,void *param_2)

{
  int iVar1;
  stCoRoutineEnv_t *psVar2;
  stCoRoutine_t *pending_co;
  stCoRoutine_t *curr;
  
  if (co->pfn != (pfn_co_routine_t)0x0) {
    (*co->pfn)(co->arg);
  }
  co->cEnd = '\x01';
  psVar2 = co->env;
  iVar1 = psVar2->iCallStackSize;
  pending_co = psVar2->pCallStack[(long)iVar1 + -2];
  curr = psVar2->pCallStack[(long)iVar1 + -1];
  psVar2->iCallStackSize = iVar1 + -1;
  co_swap(curr,pending_co);
  return 0;
}

Assistant:

static int CoRoutineFunc( stCoRoutine_t *co,void * )
{
	if( co->pfn )
	{
		co->pfn( co->arg );
	}
	co->cEnd = 1;

	stCoRoutineEnv_t *env = co->env;

	co_yield_env( env );

	return 0;
}